

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

uint64_t Imf_3_4::IDManifest::MurmurHash64(string *idString)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  uint8_t *data;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  pcVar1 = (idString->_M_dataplus)._M_p;
  uVar3 = (uint)idString->_M_string_length;
  uVar5 = (long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | idString->_M_string_length & 0xffffffff
                ) / 0x10;
  lVar4 = 0;
  iVar2 = (int)uVar5;
  uVar6 = 0;
  if (0 < iVar2) {
    uVar6 = uVar5 & 0xffffffff;
  }
  uVar5 = 0;
  uVar7 = 0;
  for (; uVar6 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    uVar7 = ((ulong)(*(long *)(pcVar1 + lVar4) * -0x783c846eeebdac2b) >> 0x21 |
            *(long *)(pcVar1 + lVar4) * -0x775ed61580000000) * 0x4cf5ad432745937f ^ uVar7;
    lVar8 = (uVar7 << 0x1b | uVar7 >> 0x25) + uVar5;
    uVar5 = ((ulong)(*(long *)(pcVar1 + lVar4 + 8) * 0x4cf5ad432745937f) >> 0x1f |
            *(long *)(pcVar1 + lVar4 + 8) * 0x4e8b26fe00000000) * -0x783c846eeebdac2b ^ uVar5;
    uVar7 = lVar8 * 5 + 0x52dce729;
    uVar5 = (lVar8 * 5 + (uVar5 << 0x1f | uVar5 >> 0x21) + 0x52dce729) * 5 + 0x38495ab5;
  }
  lVar4 = (long)iVar2 * 0x10;
  uVar6 = 0;
  switch(uVar3 & 0xf) {
  case 0xf:
    uVar6 = (ulong)(byte)pcVar1[lVar4 + 0xe] << 0x30;
  case 0xe:
    uVar6 = uVar6 | (ulong)(byte)pcVar1[lVar4 + 0xd] << 0x28;
  case 0xd:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 0xc] << 0x20;
  case 0xc:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 0xb] << 0x18;
  case 0xb:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 10] << 0x10;
  case 10:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 9] << 8;
  case 9:
    uVar5 = uVar5 ^ (((byte)pcVar1[lVar4 + 8] ^ uVar6) * 0x4cf5ad432745937f >> 0x1f |
                    ((byte)pcVar1[lVar4 + 8] ^ uVar6) * 0x4e8b26fe00000000) * -0x783c846eeebdac2b;
  case 8:
    uVar6 = (ulong)(byte)pcVar1[lVar4 + 7] << 0x38;
  case 7:
    uVar6 = uVar6 | (ulong)(byte)pcVar1[lVar4 + 6] << 0x30;
  case 6:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 5] << 0x28;
  case 5:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 4] << 0x20;
  case 4:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 3] << 0x18;
  case 3:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 2] << 0x10;
  case 2:
    uVar6 = uVar6 ^ (ulong)(byte)pcVar1[lVar4 + 1] << 8;
  case 1:
    uVar7 = uVar7 ^ (((byte)pcVar1[lVar4] ^ uVar6) * -0x783c846eeebdac2b >> 0x21 |
                    ((byte)pcVar1[lVar4] ^ uVar6) * -0x775ed61580000000) * 0x4cf5ad432745937f;
  case 0:
    uVar5 = uVar5 ^ (long)(int)uVar3;
    uVar6 = (uVar7 ^ (long)(int)uVar3) + uVar5;
    uVar5 = uVar5 + uVar6;
    uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
    uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3b314601e57a13ad;
    uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0xae502812aa7333;
    uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3b314601e57a13ad;
    return (uVar5 >> 0x21 ^ uVar5) + (uVar6 >> 0x21 ^ uVar6);
  }
}

Assistant:

uint64_t
IDManifest::MurmurHash64 (const std::string& idString)
{

    uint64_t out[2];
    MurmurHash3_x64_128 (idString.c_str (), idString.size (), 0, out);
    return out[0];
}